

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

CNode * __thiscall CConnman::FindNode(CConnman *this,string *addrName)

{
  pointer ppCVar1;
  __type_conflict _Var2;
  CNode *pCVar3;
  pointer ppCVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  unique_lock<std::recursive_mutex> uStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_38,&this->m_nodes_mutex,
             "m_nodes_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0x153,false);
  ppCVar4 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppCVar4 == ppCVar1) {
      pCVar3 = (CNode *)0x0;
      break;
    }
    pCVar3 = *ppCVar4;
    _Var2 = std::operator==(&pCVar3->m_addr_name,addrName);
    ppCVar4 = ppCVar4 + 1;
  } while (!_Var2);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return pCVar3;
}

Assistant:

CNode* CConnman::FindNode(const std::string& addrName)
{
    LOCK(m_nodes_mutex);
    for (CNode* pnode : m_nodes) {
        if (pnode->m_addr_name == addrName) {
            return pnode;
        }
    }
    return nullptr;
}